

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_slider_int(nk_context *ctx,int min,int *val,int max,int step)

{
  int iVar1;
  nk_bool nVar2;
  int *in_RDX;
  float value;
  int ret;
  float *in_stack_00000028;
  float in_stack_00000034;
  nk_context *in_stack_00000038;
  
  iVar1 = *in_RDX;
  nVar2 = nk_slider_float(in_stack_00000038,in_stack_00000034,in_stack_00000028,ctx._4_4_,ctx._0_4_)
  ;
  *in_RDX = (int)(float)iVar1;
  return nVar2;
}

Assistant:

NK_API nk_bool
nk_slider_int(struct nk_context *ctx, int min, int *val, int max, int step)
{
int ret;
float value = (float)*val;
ret = nk_slider_float(ctx, (float)min, &value, (float)max, (float)step);
*val =  (int)value;
return ret;
}